

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayGenericBinaryBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  ClientContext *pCVar3;
  size_type sVar4;
  undefined8 uVar5;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  reference pvVar10;
  pointer pEVar11;
  pointer pEVar12;
  reference pvVar13;
  reference pvVar14;
  idx_t index;
  idx_t iVar15;
  LogicalType *left;
  LogicalType *right;
  InvalidInputException *this_01;
  ParameterNotResolvedException *this_02;
  BinderException *pBVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  LogicalType common_type;
  string local_180;
  ScalarFunction *local_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_140;
  optional_idx local_138;
  optional_idx local_130;
  LogicalType local_128;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_158 = context;
  local_140._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  iVar9 = (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[6])(pEVar11);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (pEVar11->super_BaseExpression)._vptr_BaseExpression;
  bVar7 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar11);
  if (((byte)iVar9 & bVar7) == 1) {
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
    __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  pvVar14 = &pEVar11->return_type;
  if ((byte)iVar9 != 0) {
    pvVar14 = &pEVar12->return_type;
  }
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  local_160 = bound_function;
  pvVar13 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
  if (pvVar13 != pvVar14) {
    pvVar13->id_ = pvVar14->id_;
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)params >> 8),pvVar14->physical_type_);
    pvVar13->physical_type_ = pvVar14->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar13->type_info_,&pvVar14->type_info_);
  }
  pvVar14 = &pEVar12->return_type;
  if (bVar7 != 0) {
    pvVar14 = &pEVar11->return_type;
  }
  pvVar13 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
  if (pvVar13 != pvVar14) {
    pvVar13->id_ = pvVar14->id_;
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)params >> 8),pvVar14->physical_type_);
    pvVar13->physical_type_ = pvVar14->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar13->type_info_,&pvVar14->type_info_);
  }
  pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
  if (pvVar14->id_ == ARRAY) {
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
    if (pvVar14->id_ == ARRAY) {
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
      index = ArrayType::GetSize(pvVar14);
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
      iVar15 = ArrayType::GetSize(pvVar14);
      if (index != iVar15) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"%s: Array arguments must be of the same size","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar2 = (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,
                   pcVar2 + (local_160->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar16,&local_180,&local_b0);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
      left = ArrayType::GetChildType(pvVar14);
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
      right = ArrayType::GetChildType(pvVar14);
      LogicalType::LogicalType(&local_128);
      bVar8 = LogicalType::TryGetMaxLogicalType(local_158,left,right,&local_128);
      if (bVar8) {
        if ((local_128.id_ & ~SQLNULL) == FLOAT) {
          optional_idx::optional_idx(&local_130,index);
          LogicalType::ARRAY((LogicalType *)&local_180,&local_128,local_130);
          pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
          uVar5 = local_180.field_2._M_allocated_capacity;
          sVar4 = local_180._M_string_length;
          pvVar14->id_ = (LogicalTypeId)local_180._M_dataplus._M_p;
          pvVar14->physical_type_ = local_180._M_dataplus._M_p._1_1_;
          uVar17 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar18 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          pCVar3 = (ClientContext *)
                   (pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar19 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar20 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_180._M_string_length = 0;
          local_180.field_2._M_allocated_capacity = 0;
          p_Var1 = (pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)sVar4;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_158 = pCVar3;
            uStack_150 = uVar19;
            uStack_14c = uVar20;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            uVar17 = (undefined4)local_158;
            uVar18 = local_158._4_4_;
            uVar19 = uStack_150;
            uVar20 = uStack_14c;
          }
          uVar5 = local_180.field_2._M_allocated_capacity;
          local_180._M_string_length = CONCAT44(uVar18,uVar17);
          local_180.field_2._M_allocated_capacity._4_4_ = uVar20;
          local_180.field_2._M_allocated_capacity._0_4_ = uVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
          }
          LogicalType::~LogicalType((LogicalType *)&local_180);
          optional_idx::optional_idx(&local_138,index);
          LogicalType::ARRAY((LogicalType *)&local_180,&local_128,local_138);
          pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
          uVar5 = local_180.field_2._M_allocated_capacity;
          sVar4 = local_180._M_string_length;
          pvVar14->id_ = (LogicalTypeId)local_180._M_dataplus._M_p;
          pvVar14->physical_type_ = local_180._M_dataplus._M_p._1_1_;
          uVar17 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar18 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          pCVar3 = (ClientContext *)
                   (pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar19 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar20 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_180._M_string_length = 0;
          local_180.field_2._M_allocated_capacity = 0;
          p_Var1 = (pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)sVar4;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_158 = pCVar3;
            uStack_150 = uVar19;
            uStack_14c = uVar20;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            uVar17 = (undefined4)local_158;
            uVar18 = local_158._4_4_;
            uVar19 = uStack_150;
            uVar20 = uStack_14c;
          }
          uVar5 = local_180.field_2._M_allocated_capacity;
          local_180._M_string_length = CONCAT44(uVar18,uVar17);
          local_180.field_2._M_allocated_capacity._4_4_ = uVar20;
          local_180.field_2._M_allocated_capacity._0_4_ = uVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
          }
          LogicalType::~LogicalType((LogicalType *)&local_180);
          _Var6._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
          .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
               local_140._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
          *(undefined8 *)
           local_140._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
          LogicalType::~LogicalType(&local_128);
          return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                 (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  )_Var6._M_t.
                   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                   .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
        }
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"%s: Arguments must be arrays of FLOAT or DOUBLE","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar2 = (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,
                   pcVar2 + (local_160->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar16,&local_180,&local_f0);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,
                 "%s: Cannot infer common element type (left = \'%s\', right = \'%s\')","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar2 = (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,
                 pcVar2 + (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name._M_string_length);
      LogicalType::ToString_abi_cxx11_(&local_50,left);
      LogicalType::ToString_abi_cxx11_(&local_70,right);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (pBVar16,&local_180,&local_d0,&local_50,&local_70);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_110[0] = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"%s: Arguments must be arrays of FLOAT or DOUBLE","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (local_160->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                      ._M_string_length);
  StringUtil::Format<std::__cxx11::string>(&local_180,(StringUtil *)local_110,&local_90,params);
  InvalidInputException::InvalidInputException(this_01,&local_180);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ArrayGenericBinaryBind(ClientContext &context, ScalarFunction &bound_function,
                                                       vector<unique_ptr<Expression>> &arguments) {

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_type = arguments[0]->return_type;
	const auto &rhs_type = arguments[1]->return_type;

	bound_function.arguments[0] = lhs_is_param ? rhs_type : lhs_type;
	bound_function.arguments[1] = rhs_is_param ? lhs_type : rhs_type;

	if (bound_function.arguments[0].id() != LogicalTypeId::ARRAY ||
	    bound_function.arguments[1].id() != LogicalTypeId::ARRAY) {
		throw InvalidInputException(
		    StringUtil::Format("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name));
	}

	const auto lhs_size = ArrayType::GetSize(bound_function.arguments[0]);
	const auto rhs_size = ArrayType::GetSize(bound_function.arguments[1]);

	if (lhs_size != rhs_size) {
		throw BinderException("%s: Array arguments must be of the same size", bound_function.name);
	}

	const auto &lhs_element_type = ArrayType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_element_type = ArrayType::GetChildType(bound_function.arguments[1]);

	// Resolve common type
	LogicalType common_type;
	if (!LogicalType::TryGetMaxLogicalType(context, lhs_element_type, rhs_element_type, common_type)) {
		throw BinderException("%s: Cannot infer common element type (left = '%s', right = '%s')", bound_function.name,
		                      lhs_element_type.ToString(), rhs_element_type.ToString());
	}

	// Ensure it is float or double
	if (common_type.id() != LogicalTypeId::FLOAT && common_type.id() != LogicalTypeId::DOUBLE) {
		throw BinderException("%s: Arguments must be arrays of FLOAT or DOUBLE", bound_function.name);
	}

	// The important part is just that we resolve the size of the input arrays
	bound_function.arguments[0] = LogicalType::ARRAY(common_type, lhs_size);
	bound_function.arguments[1] = LogicalType::ARRAY(common_type, rhs_size);

	return nullptr;
}